

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-uname.c
# Opt level: O0

int run_test_uname(void)

{
  int iVar1;
  char local_58e [2];
  int r;
  uv_utsname_t buffer;
  utsname buf;
  
  iVar1 = uv_os_uname(0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-uname.c"
            ,0x2a,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_os_uname(local_58e);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-uname.c"
            ,0x2e,"r == 0");
    abort();
  }
  iVar1 = uname((utsname *)(buffer.machine + 0xf8));
  if (iVar1 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-uname.c"
            ,0x31,"uname(&buf) != -1");
    abort();
  }
  iVar1 = strcmp(local_58e,buffer.machine + 0xf8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-uname.c"
            ,0x32,"strcmp(buffer.sysname, buf.sysname) == 0");
    abort();
  }
  iVar1 = strcmp(buffer.release + 0xf8,buf.release + 0x39);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-uname.c"
            ,0x33,"strcmp(buffer.version, buf.version) == 0");
    abort();
  }
  iVar1 = strcmp(buffer.sysname + 0xf8,buf.nodename + 0x39);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-uname.c"
            ,0x39,"strcmp(buffer.release, buf.release) == 0");
    abort();
  }
  iVar1 = strcmp(buffer.version + 0xf8,buf.version + 0x39);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-uname.c"
            ,0x3f,"strcmp(buffer.machine, buf.machine) == 0");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(uname) {
#ifndef _WIN32
  struct utsname buf;
#endif
#ifdef _AIX
  char temp[256];
#endif
  uv_utsname_t buffer;
  int r;

  /* Verify that NULL is handled properly. */
  r = uv_os_uname(NULL);
  ASSERT(r == UV_EINVAL);

  /* Verify the happy path. */
  r = uv_os_uname(&buffer);
  ASSERT(r == 0);

#ifndef _WIN32
  ASSERT(uname(&buf) != -1);
  ASSERT(strcmp(buffer.sysname, buf.sysname) == 0);
  ASSERT(strcmp(buffer.version, buf.version) == 0);

# ifdef _AIX
  snprintf(temp, sizeof(temp), "%s.%s", buf.version, buf.release);
  ASSERT(strcmp(buffer.release, temp) == 0);
# else
  ASSERT(strcmp(buffer.release, buf.release) == 0);
# endif /* _AIX */

# if defined(_AIX) || defined(__PASE__)
  ASSERT(strcmp(buffer.machine, "ppc64") == 0);
# else
  ASSERT(strcmp(buffer.machine, buf.machine) == 0);
# endif /* defined(_AIX) || defined(__PASE__) */

#endif /* _WIN32 */

  return 0;
}